

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

void __thiscall
notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,LayerSpec *spec)

{
  element_type *peVar1;
  ostream *poVar2;
  
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"layer: ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(spec->tag)._M_dataplus._M_p,(spec->tag)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (spec->inputDim != 0) {
    poVar2 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"inputs: ",8);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (spec->outputDim != 0) {
    poVar2 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"outputs: ",9);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((spec->activation).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    poVar2 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"activation: ",0xc);
    peVar1 = (spec->activation).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(peVar1->_M_dataplus)._M_p,peVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (((spec->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     ((spec->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"bias_and_weights:\n",0x12);
    saveWeightsAndBias(this,(spec->weights).
                            super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,
                       (spec->bias).
                       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    return;
  }
  return;
}

Assistant:

void save(LayerSpec &spec) {
        out << "layer: " << spec.tag << "\n";
        if (spec.inputDim) {
            out << "inputs: " << spec.inputDim << "\n";
        }
        if (spec.outputDim) {
            out << "outputs: " << spec.outputDim << "\n";
        }
        if (spec.activation) {
            out << "activation: " << *spec.activation << "\n";
        }
        if (spec.weights && spec.bias) {
            out << "bias_and_weights:\n";
            saveWeightsAndBias(*spec.weights, *spec.bias);
        }
    }